

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O1

deSocketResult deSocket_send(deSocket *sock,void *buf,size_t bufSize,size_t *numSentPtr)

{
  deSocketResult dVar1;
  ssize_t sVar2;
  size_t sVar3;
  int numBytes;
  
  sVar2 = send(sock->handle,buf,bufSize,0);
  numBytes = (int)sVar2;
  dVar1 = mapSendRecvResult(numBytes);
  if (numSentPtr != (size_t *)0x0) {
    sVar3 = 0;
    if (0 < numBytes) {
      sVar3 = (long)numBytes;
    }
    *numSentPtr = sVar3;
  }
  if (dVar1 == DE_SOCKETRESULT_CONNECTION_TERMINATED) {
    deMutex_lock(sock->stateLock);
    sock->openChannels = sock->openChannels & 0xfffffffc;
  }
  else {
    if (dVar1 != DE_SOCKETRESULT_CONNECTION_CLOSED) {
      return dVar1;
    }
    deMutex_lock(sock->stateLock);
    sock->openChannels = sock->openChannels & 0xfffffffd;
  }
  if (sock->openChannels == 0) {
    sock->state = DE_SOCKETSTATE_DISCONNECTED;
  }
  deMutex_unlock(sock->stateLock);
  return dVar1;
}

Assistant:

deSocketResult deSocket_send (deSocket* sock, const void* buf, size_t bufSize, size_t* numSentPtr)
{
	int				numSent	= (int)send(sock->handle, (const char*)buf, (NativeSize)bufSize, 0);
	deSocketResult	result	= mapSendRecvResult(numSent);

	if (numSentPtr)
		*numSentPtr = (numSent > 0) ? ((size_t)numSent) : (0);

	/* Update state. */
	if (result == DE_SOCKETRESULT_CONNECTION_CLOSED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_SEND);
	else if (result == DE_SOCKETRESULT_CONNECTION_TERMINATED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_BOTH);

	return result;
}